

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sMemoryTests.cpp
# Opt level: O1

int __thiscall deqp::gles3::Stress::MemoryTests::init(MemoryTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  MemoryStressCase *pMVar3;
  TestNode *pTVar4;
  
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"basic","Basic allocation stress tests.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0217f168;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x100000,0x100000,false,false,false,
             false,"buffer_1mb_no_write_no_use","1MiB buffer allocations, no data writes, no use");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x100000,0x100000,true,false,false,
             false,"buffer_1mb_write_no_use","1MiB buffer allocations, data writes, no use");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x100000,0x100000,false,true,false,
             false,"buffer_1mb_no_write_use","1MiB buffer allocations, no data writes, data used");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x100000,0x100000,true,true,false,
             false,"buffer_1mb_write_use","1MiB buffer allocations, data writes, data used");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x800000,0x800000,false,false,false,
             false,"buffer_8mb_no_write_no_use","8MiB buffer allocations, no data writes, no use");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x800000,0x800000,true,false,false,
             false,"buffer_8mb_write_no_use","8MiB buffer allocations, data writes, no use");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x800000,0x800000,false,true,false,
             false,"buffer_8mb_no_write_use","8MiB buffer allocations, no data writes, data used");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x800000,0x800000,true,true,false,
             false,"buffer_8mb_write_use","8MiB buffer allocations, data writes, data used");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x2000000,0x2000000,false,false,
             false,false,"buffer_32mb_no_write_no_use",
             "32MiB buffer allocations, no data writes, no use");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x2000000,0x2000000,true,false,false
             ,false,"buffer_32mb_write_no_use","32MiB buffer allocations, data writes, no use");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x2000000,0x2000000,false,true,false
             ,false,"buffer_32mb_no_write_use","32MiB buffer allocations, no data writes, data used"
            );
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x2000000,0x2000000,true,true,false,
             false,"buffer_32mb_write_use","32MiB buffer allocations, data writes, data used");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,1,0x200,0x200,0,0,false,false,false,false,
             "texture_512x512_rgba_no_write_no_use",
             "512x512 RGBA texture allocations, no data writes, no use");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,1,0x200,0x200,0,0,true,false,false,false,
             "texture_512x512_rgba_write_no_use",
             "512x512 RGBA texture allocations, data writes, no use");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,1,0x200,0x200,0,0,false,true,false,false,
             "texture_512x512_rgba_no_write_use",
             "512x512 RGBA texture allocations, no data writes, data used");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,1,0x200,0x200,0,0,true,true,false,false,
             "texture_512x512_rgba_write_use",
             "512x512 RGBA texture allocations, data writes, data used");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar3);
  pTVar4 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,pCVar1->m_testCtx,"random","Random allocation stress tests.");
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_0217f168;
  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar1;
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x40,0x100000,false,false,false,
             false,"buffer_small_no_write_no_use",
             "Random small buffer allocations, no data writes, no use");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x40,0x100000,true,false,false,false
             ,"buffer_small_write_no_use","Random small allocations, data writes, no use");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x40,0x100000,false,true,false,false
             ,"buffer_small_no_write_use","Random small allocations, no data writes, data used");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x40,0x100000,true,true,false,false,
             "buffer_small_write_use","Random small allocations, data writes, data used");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x200000,0x2000000,false,false,false
             ,false,"buffer_large_no_write_no_use",
             "Random large buffer allocations, no data writes, no use");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x200000,0x2000000,true,false,false,
             false,"buffer_large_write_no_use",
             "Random large buffer allocations, data writes, no use");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x200000,0x2000000,false,true,false,
             false,"buffer_large_no_write_use",
             "Random large buffer allocations, no data writes, data used");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x200000,0x2000000,true,true,false,
             false,"buffer_large_write_use",
             "Random large buffer allocations, data writes, data used");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,1,8,0x100,0,0,false,false,false,false,
             "texture_small_rgba_no_write_no_use",
             "Small RGBA texture allocations, no data writes, no use");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,1,8,0x100,0,0,true,false,false,false,
             "texture_small_rgba_write_no_use","Small RGBA texture allocations, data writes, no use"
            );
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,1,8,0x100,0,0,false,true,false,false,
             "texture_small_rgba_no_write_use",
             "Small RGBA texture allocations, no data writes, data used");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,1,8,0x100,0,0,true,true,false,false,
             "texture_small_rgba_write_use","Small RGBA texture allocations, data writes, data used"
            );
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,1,0x200,0x400,0,0,false,false,false,false,
             "texture_large_rgba_no_write_no_use",
             "Large RGBA texture allocations, no data writes, no use");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,1,0x200,0x400,0,0,true,false,false,false,
             "texture_large_rgba_write_no_use","Large RGBA texture allocations, data writes, no use"
            );
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,1,0x200,0x400,0,0,false,true,false,false,
             "texture_large_rgba_no_write_use",
             "Large RGBA texture allocations, no data writes, data used");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,1,0x200,0x400,0,0,true,true,false,false,
             "texture_large_rgba_write_use","Large RGBA texture allocations, data writes, data used"
            );
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,3,8,0x100,0x40,0x100000,false,false,false,
             false,"mixed_small_rgba_no_write_no_use",
             "Small RGBA mixed allocations, no data writes, no use");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,3,8,0x100,0x40,0x100000,true,false,false,
             false,"mixed_small_rgba_write_no_use",
             "Small RGBA mixed allocations, data writes, no use");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,3,8,0x100,0x40,0x100000,false,true,false,
             false,"mixed_small_rgba_no_write_use",
             "Small RGBA mixed allocations, no data writes, data used");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,3,8,0x100,0x40,0x100000,true,true,false,
             false,"mixed_small_rgba_write_use",
             "Small RGBA mixed allocations, data writes, data used");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,3,0x200,0x400,0x200000,0x2000000,false,
             false,false,false,"mixed_large_rgba_no_write_no_use",
             "Large RGBA mixed allocations, no data writes, no use");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,3,0x200,0x400,0x200000,0x2000000,true,
             false,false,false,"mixed_large_rgba_write_no_use",
             "Large RGBA mixed allocations, data writes, no use");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,3,0x200,0x400,0x200000,0x2000000,false,
             true,false,false,"mixed_large_rgba_no_write_use",
             "Large RGBA mixed allocations, no data writes, data used");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,3,0x200,0x400,0x200000,0x2000000,true,true
             ,false,false,"mixed_large_rgba_write_use",
             "Large RGBA mixed allocations, data writes, data used");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"basic_clear",
             "Basic allocation stress tests with glClear after OOM.");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0217f168;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x100000,0x100000,false,false,false,
             true,"buffer_1mb_no_write_no_use","1MiB buffer allocations, no data writes, no use");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x100000,0x100000,true,false,false,
             true,"buffer_1mb_write_no_use","1MiB buffer allocations, data writes, no use");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x100000,0x100000,false,true,false,
             true,"buffer_1mb_no_write_use","1MiB buffer allocations, no data writes, data used");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x100000,0x100000,true,true,false,
             true,"buffer_1mb_write_use","1MiB buffer allocations, data writes, data used");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x800000,0x800000,false,false,false,
             true,"buffer_8mb_no_write_no_use","8MiB buffer allocations, no data writes, no use");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x800000,0x800000,true,false,false,
             true,"buffer_8mb_write_no_use","8MiB buffer allocations, data writes, no use");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x800000,0x800000,false,true,false,
             true,"buffer_8mb_no_write_use","8MiB buffer allocations, no data writes, data used");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x800000,0x800000,true,true,false,
             true,"buffer_8mb_write_use","8MiB buffer allocations, data writes, data used");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x2000000,0x2000000,false,false,
             false,true,"buffer_32mb_no_write_no_use",
             "32MiB buffer allocations, no data writes, no use");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x2000000,0x2000000,true,false,false
             ,true,"buffer_32mb_write_no_use","32MiB buffer allocations, data writes, no use");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x2000000,0x2000000,false,true,false
             ,true,"buffer_32mb_no_write_use","32MiB buffer allocations, no data writes, data used")
  ;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x2000000,0x2000000,true,true,false,
             true,"buffer_32mb_write_use","32MiB buffer allocations, data writes, data used");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,1,0x200,0x200,0,0,false,false,false,true,
             "texture_512x512_rgba_no_write_no_use",
             "512x512 RGBA texture allocations, no data writes, no use");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,1,0x200,0x200,0,0,true,false,false,true,
             "texture_512x512_rgba_write_no_use",
             "512x512 RGBA texture allocations, data writes, no use");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,1,0x200,0x200,0,0,false,true,false,true,
             "texture_512x512_rgba_no_write_use",
             "512x512 RGBA texture allocations, no data writes, data used");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,1,0x200,0x200,0,0,true,true,false,true,
             "texture_512x512_rgba_write_use",
             "512x512 RGBA texture allocations, data writes, data used");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pMVar3);
  pTVar4 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,pCVar1->m_testCtx,"random_clear",
             "Random allocation stress tests with glClear after OOM.");
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_0217f168;
  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar1;
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x40,0x100000,false,false,false,true
             ,"buffer_small_no_write_no_use",
             "Random small buffer allocations, no data writes, no use");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x40,0x100000,true,false,false,true,
             "buffer_small_write_no_use","Random small allocations, data writes, no use");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x40,0x100000,false,true,false,true,
             "buffer_small_no_write_use","Random small allocations, no data writes, data used");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x40,0x100000,true,true,false,true,
             "buffer_small_write_use","Random small allocations, data writes, data used");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x200000,0x2000000,false,false,false
             ,true,"buffer_large_no_write_no_use",
             "Random large buffer allocations, no data writes, no use");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x200000,0x2000000,true,false,false,
             true,"buffer_large_write_no_use","Random large buffer allocations, data writes, no use"
            );
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x200000,0x2000000,false,true,false,
             true,"buffer_large_no_write_use",
             "Random large buffer allocations, no data writes, data used");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,2,0,0,0x200000,0x2000000,true,true,false,
             true,"buffer_large_write_use","Random large buffer allocations, data writes, data used"
            );
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,1,8,0x100,0,0,false,false,false,true,
             "texture_small_rgba_no_write_no_use",
             "Small RGBA texture allocations, no data writes, no use");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,1,8,0x100,0,0,true,false,false,true,
             "texture_small_rgba_write_no_use","Small RGBA texture allocations, data writes, no use"
            );
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,1,8,0x100,0,0,false,true,false,true,
             "texture_small_rgba_no_write_use",
             "Small RGBA texture allocations, no data writes, data used");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,1,8,0x100,0,0,true,true,false,true,
             "texture_small_rgba_write_use","Small RGBA texture allocations, data writes, data used"
            );
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,1,0x200,0x400,0,0,false,false,false,true,
             "texture_large_rgba_no_write_no_use",
             "Large RGBA texture allocations, no data writes, no use");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,1,0x200,0x400,0,0,true,false,false,true,
             "texture_large_rgba_write_no_use","Large RGBA texture allocations, data writes, no use"
            );
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,1,0x200,0x400,0,0,false,true,false,true,
             "texture_large_rgba_no_write_use",
             "Large RGBA texture allocations, no data writes, data used");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,1,0x200,0x400,0,0,true,true,false,true,
             "texture_large_rgba_write_use","Large RGBA texture allocations, data writes, data used"
            );
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,3,8,0x100,0x40,0x100000,false,false,false,
             true,"mixed_small_rgba_no_write_no_use",
             "Small RGBA mixed allocations, no data writes, no use");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,3,8,0x100,0x40,0x100000,true,false,false,
             true,"mixed_small_rgba_write_no_use",
             "Small RGBA mixed allocations, data writes, no use");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,3,8,0x100,0x40,0x100000,false,true,false,
             true,"mixed_small_rgba_no_write_use",
             "Small RGBA mixed allocations, no data writes, data used");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,3,8,0x100,0x40,0x100000,true,true,false,
             true,"mixed_small_rgba_write_use",
             "Small RGBA mixed allocations, data writes, data used");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,3,0x200,0x400,0x200000,0x2000000,false,
             false,false,true,"mixed_large_rgba_no_write_no_use",
             "Large RGBA mixed allocations, no data writes, no use");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,3,0x200,0x400,0x200000,0x2000000,true,
             false,false,true,"mixed_large_rgba_write_no_use",
             "Large RGBA mixed allocations, data writes, no use");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,3,0x200,0x400,0x200000,0x2000000,false,
             true,false,true,"mixed_large_rgba_no_write_use",
             "Large RGBA mixed allocations, no data writes, data used");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  pMVar3 = (MemoryStressCase *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::MemoryStressCase::MemoryStressCase
            (pMVar3,pCVar1->m_testCtx,pCVar1->m_renderCtx,3,0x200,0x400,0x200000,0x2000000,true,true
             ,false,true,"mixed_large_rgba_write_use",
             "Large RGBA mixed allocations, data writes, data used");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar3);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  return extraout_EAX;
}

Assistant:

void MemoryTests::init (void)
{
	const int MiB = 1024*1024;

	// Basic tests
	tcu::TestCaseGroup* basicGroup = new TestCaseGroup(m_context, "basic", "Basic allocation stress tests.");

	// Buffers
	basicGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 1*MiB, 1*MiB, false, false, false, false,	"buffer_1mb_no_write_no_use",	"1MiB buffer allocations, no data writes, no use"));
	basicGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 1*MiB, 1*MiB, true,  false, false, false,	"buffer_1mb_write_no_use",		"1MiB buffer allocations, data writes, no use"));
	basicGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 1*MiB, 1*MiB, false, true,  false, false,	"buffer_1mb_no_write_use",		"1MiB buffer allocations, no data writes, data used"));
	basicGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 1*MiB, 1*MiB, true,  true,  false, false,	"buffer_1mb_write_use",			"1MiB buffer allocations, data writes, data used"));

	basicGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 8*MiB, 8*MiB, false, false, false, false,	"buffer_8mb_no_write_no_use",	"8MiB buffer allocations, no data writes, no use"));
	basicGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 8*MiB, 8*MiB, true,  false, false, false,	"buffer_8mb_write_no_use",		"8MiB buffer allocations, data writes, no use"));
	basicGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 8*MiB, 8*MiB, false, true,  false, false,	"buffer_8mb_no_write_use",		"8MiB buffer allocations, no data writes, data used"));
	basicGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 8*MiB, 8*MiB, true,  true,  false, false,	"buffer_8mb_write_use",			"8MiB buffer allocations, data writes, data used"));

	basicGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 32*MiB, 32*MiB, false, false, false, false,	"buffer_32mb_no_write_no_use",	"32MiB buffer allocations, no data writes, no use"));
	basicGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 32*MiB, 32*MiB, true,  false, false, false,	"buffer_32mb_write_no_use",		"32MiB buffer allocations, data writes, no use"));
	basicGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 32*MiB, 32*MiB, false, true,  false, false,	"buffer_32mb_no_write_use",		"32MiB buffer allocations, no data writes, data used"));
	basicGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 32*MiB, 32*MiB, true, true,  false, false,	"buffer_32mb_write_use",		"32MiB buffer allocations, data writes, data used"));

	// Textures
	basicGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE, 512, 512, 0, 0, false, false, false, false,	"texture_512x512_rgba_no_write_no_use",	"512x512 RGBA texture allocations, no data writes, no use"));
	basicGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE, 512, 512, 0, 0, true,  false, false, false,	"texture_512x512_rgba_write_no_use",	"512x512 RGBA texture allocations, data writes, no use"));
	basicGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE, 512, 512, 0, 0, false, true,  false, false,	"texture_512x512_rgba_no_write_use",	"512x512 RGBA texture allocations, no data writes, data used"));
	basicGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE, 512, 512, 0, 0, true, true,  false, false,	"texture_512x512_rgba_write_use",		"512x512 RGBA texture allocations, data writes, data used"));

	// Random tests
	tcu::TestCaseGroup*	randomGroup = new TestCaseGroup(m_context, "random", "Random allocation stress tests.");

	// Buffers
	randomGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 64, 1*MiB, false, false, false, false,	"buffer_small_no_write_no_use",		"Random small buffer allocations, no data writes, no use"));
	randomGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 64, 1*MiB, true,  false, false, false,	"buffer_small_write_no_use",		"Random small allocations, data writes, no use"));
	randomGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 64, 1*MiB, false, true,  false, false,	"buffer_small_no_write_use",		"Random small allocations, no data writes, data used"));
	randomGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 64, 1*MiB, true,  true,  false, false,	"buffer_small_write_use",			"Random small allocations, data writes, data used"));

	randomGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 2*MiB, 32*MiB, false, false, false, false,	"buffer_large_no_write_no_use",		"Random large buffer allocations, no data writes, no use"));
	randomGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 2*MiB, 32*MiB, true,  false, false, false,	"buffer_large_write_no_use",		"Random large buffer allocations, data writes, no use"));
	randomGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 2*MiB, 32*MiB, false, true,  false, false,	"buffer_large_no_write_use",		"Random large buffer allocations, no data writes, data used"));
	randomGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 2*MiB, 32*MiB, true,  true,  false, false,	"buffer_large_write_use",			"Random large buffer allocations, data writes, data used"));

	// Textures
	randomGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE, 8, 256, 0, 0, false, false, false, false,	"texture_small_rgba_no_write_no_use",	"Small RGBA texture allocations, no data writes, no use"));
	randomGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE, 8, 256, 0, 0, true,  false, false, false,	"texture_small_rgba_write_no_use",		"Small RGBA texture allocations, data writes, no use"));
	randomGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE, 8, 256, 0, 0, false, true,  false, false,	"texture_small_rgba_no_write_use",		"Small RGBA texture allocations, no data writes, data used"));
	randomGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE, 8, 256, 0, 0, true,  true,  false, false,	"texture_small_rgba_write_use",			"Small RGBA texture allocations, data writes, data used"));

	randomGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE, 512, 1024, 0, 0, false, false, false, false,	"texture_large_rgba_no_write_no_use",	"Large RGBA texture allocations, no data writes, no use"));
	randomGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE, 512, 1024, 0, 0, true,  false, false, false,	"texture_large_rgba_write_no_use",		"Large RGBA texture allocations, data writes, no use"));
	randomGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE, 512, 1024, 0, 0, false, true,  false, false,	"texture_large_rgba_no_write_use",		"Large RGBA texture allocations, no data writes, data used"));
	randomGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE, 512, 1024, 0, 0, true,  true,  false, false,	"texture_large_rgba_write_use",			"Large RGBA texture allocations, data writes, data used"));

	randomGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE|MEMOBJECTTYPE_BUFFER, 8, 256, 64, 1*MiB, false, false, false, false,	"mixed_small_rgba_no_write_no_use",		"Small RGBA mixed allocations, no data writes, no use"));
	randomGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE|MEMOBJECTTYPE_BUFFER, 8, 256, 64, 1*MiB, true,  false, false, false,	"mixed_small_rgba_write_no_use",		"Small RGBA mixed allocations, data writes, no use"));
	randomGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE|MEMOBJECTTYPE_BUFFER, 8, 256, 64, 1*MiB, false, true,  false, false,	"mixed_small_rgba_no_write_use",		"Small RGBA mixed allocations, no data writes, data used"));
	randomGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE|MEMOBJECTTYPE_BUFFER, 8, 256, 64, 1*MiB, true,  true,  false, false,	"mixed_small_rgba_write_use",			"Small RGBA mixed allocations, data writes, data used"));

	randomGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE|MEMOBJECTTYPE_BUFFER, 512, 1024, 2*MiB, 32*MiB, false, false, false, false,	"mixed_large_rgba_no_write_no_use",		"Large RGBA mixed allocations, no data writes, no use"));
	randomGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE|MEMOBJECTTYPE_BUFFER, 512, 1024, 2*MiB, 32*MiB, true,  false, false, false,	"mixed_large_rgba_write_no_use",		"Large RGBA mixed allocations, data writes, no use"));
	randomGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE|MEMOBJECTTYPE_BUFFER, 512, 1024, 2*MiB, 32*MiB, false, true,  false, false,	"mixed_large_rgba_no_write_use",		"Large RGBA mixed allocations, no data writes, data used"));
	randomGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE|MEMOBJECTTYPE_BUFFER, 512, 1024, 2*MiB, 32*MiB, true,  true,  false, false,	"mixed_large_rgba_write_use",			"Large RGBA mixed allocations, data writes, data used"));

	addChild(basicGroup);
	addChild(randomGroup);

	// Basic tests with clear
	tcu::TestCaseGroup* basicClearGroup	= new TestCaseGroup(m_context, "basic_clear", "Basic allocation stress tests with glClear after OOM.");

	// Buffers
	basicClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 1*MiB, 1*MiB, false, false, false, true,	"buffer_1mb_no_write_no_use",	"1MiB buffer allocations, no data writes, no use"));
	basicClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 1*MiB, 1*MiB, true,  false, false, true,	"buffer_1mb_write_no_use",		"1MiB buffer allocations, data writes, no use"));
	basicClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 1*MiB, 1*MiB, false, true,  false, true,	"buffer_1mb_no_write_use",		"1MiB buffer allocations, no data writes, data used"));
	basicClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 1*MiB, 1*MiB, true,  true,  false, true,	"buffer_1mb_write_use",			"1MiB buffer allocations, data writes, data used"));

	basicClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 8*MiB, 8*MiB, false, false, false, true,	"buffer_8mb_no_write_no_use",	"8MiB buffer allocations, no data writes, no use"));
	basicClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 8*MiB, 8*MiB, true,  false, false, true,	"buffer_8mb_write_no_use",		"8MiB buffer allocations, data writes, no use"));
	basicClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 8*MiB, 8*MiB, false, true,  false, true,	"buffer_8mb_no_write_use",		"8MiB buffer allocations, no data writes, data used"));
	basicClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 8*MiB, 8*MiB, true,  true,  false, true,	"buffer_8mb_write_use",			"8MiB buffer allocations, data writes, data used"));

	basicClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 32*MiB, 32*MiB, false, false, false, true,	"buffer_32mb_no_write_no_use",	"32MiB buffer allocations, no data writes, no use"));
	basicClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 32*MiB, 32*MiB, true,  false, false, true,	"buffer_32mb_write_no_use",		"32MiB buffer allocations, data writes, no use"));
	basicClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 32*MiB, 32*MiB, false, true,  false, true,	"buffer_32mb_no_write_use",		"32MiB buffer allocations, no data writes, data used"));
	basicClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 32*MiB, 32*MiB, true, true,  false, true,		"buffer_32mb_write_use",		"32MiB buffer allocations, data writes, data used"));

	// Textures
	basicClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE, 512, 512, 0, 0, false, false, false, true,	"texture_512x512_rgba_no_write_no_use",	"512x512 RGBA texture allocations, no data writes, no use"));
	basicClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE, 512, 512, 0, 0, true,  false, false, true,	"texture_512x512_rgba_write_no_use",	"512x512 RGBA texture allocations, data writes, no use"));
	basicClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE, 512, 512, 0, 0, false, true,  false, true,	"texture_512x512_rgba_no_write_use",	"512x512 RGBA texture allocations, no data writes, data used"));
	basicClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE, 512, 512, 0, 0, true, true,  false, true,	"texture_512x512_rgba_write_use",		"512x512 RGBA texture allocations, data writes, data used"));

	// Random tests
	tcu::TestCaseGroup*	randomClearGroup = new TestCaseGroup(m_context, "random_clear", "Random allocation stress tests with glClear after OOM.");

	// Buffers
	randomClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 64, 1*MiB, false, false, false, true,	"buffer_small_no_write_no_use",		"Random small buffer allocations, no data writes, no use"));
	randomClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 64, 1*MiB, true,  false, false, true,	"buffer_small_write_no_use",		"Random small allocations, data writes, no use"));
	randomClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 64, 1*MiB, false, true,  false, true,	"buffer_small_no_write_use",		"Random small allocations, no data writes, data used"));
	randomClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 64, 1*MiB, true,  true,  false, true,	"buffer_small_write_use",			"Random small allocations, data writes, data used"));

	randomClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 2*MiB, 32*MiB, false, false, false, true,	"buffer_large_no_write_no_use",		"Random large buffer allocations, no data writes, no use"));
	randomClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 2*MiB, 32*MiB, true,  false, false, true,	"buffer_large_write_no_use",		"Random large buffer allocations, data writes, no use"));
	randomClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 2*MiB, 32*MiB, false, true,  false, true,	"buffer_large_no_write_use",		"Random large buffer allocations, no data writes, data used"));
	randomClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_BUFFER, 0, 0, 2*MiB, 32*MiB, true,  true,  false, true,	"buffer_large_write_use",			"Random large buffer allocations, data writes, data used"));

	// Textures
	randomClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE, 8, 256, 0, 0, false, false, false, true,	"texture_small_rgba_no_write_no_use",	"Small RGBA texture allocations, no data writes, no use"));
	randomClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE, 8, 256, 0, 0, true,  false, false, true,	"texture_small_rgba_write_no_use",		"Small RGBA texture allocations, data writes, no use"));
	randomClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE, 8, 256, 0, 0, false, true,  false, true,	"texture_small_rgba_no_write_use",		"Small RGBA texture allocations, no data writes, data used"));
	randomClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE, 8, 256, 0, 0, true,  true,  false, true,	"texture_small_rgba_write_use",			"Small RGBA texture allocations, data writes, data used"));

	randomClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE, 512, 1024, 0, 0, false, false, false, true,	"texture_large_rgba_no_write_no_use",	"Large RGBA texture allocations, no data writes, no use"));
	randomClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE, 512, 1024, 0, 0, true,  false, false, true,	"texture_large_rgba_write_no_use",		"Large RGBA texture allocations, data writes, no use"));
	randomClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE, 512, 1024, 0, 0, false, true,  false, true,	"texture_large_rgba_no_write_use",		"Large RGBA texture allocations, no data writes, data used"));
	randomClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE, 512, 1024, 0, 0, true,  true,  false, true,	"texture_large_rgba_write_use",			"Large RGBA texture allocations, data writes, data used"));

	randomClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE|MEMOBJECTTYPE_BUFFER, 8, 256, 64, 1*MiB, false, false, false, true,	"mixed_small_rgba_no_write_no_use",		"Small RGBA mixed allocations, no data writes, no use"));
	randomClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE|MEMOBJECTTYPE_BUFFER, 8, 256, 64, 1*MiB, true,  false, false, true,	"mixed_small_rgba_write_no_use",		"Small RGBA mixed allocations, data writes, no use"));
	randomClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE|MEMOBJECTTYPE_BUFFER, 8, 256, 64, 1*MiB, false, true,  false, true,	"mixed_small_rgba_no_write_use",		"Small RGBA mixed allocations, no data writes, data used"));
	randomClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE|MEMOBJECTTYPE_BUFFER, 8, 256, 64, 1*MiB, true,  true,  false, true,	"mixed_small_rgba_write_use",			"Small RGBA mixed allocations, data writes, data used"));

	randomClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE|MEMOBJECTTYPE_BUFFER, 512, 1024, 2*MiB, 32*MiB, false, false, false, true,	"mixed_large_rgba_no_write_no_use",		"Large RGBA mixed allocations, no data writes, no use"));
	randomClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE|MEMOBJECTTYPE_BUFFER, 512, 1024, 2*MiB, 32*MiB, true,  false, false, true,	"mixed_large_rgba_write_no_use",		"Large RGBA mixed allocations, data writes, no use"));
	randomClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE|MEMOBJECTTYPE_BUFFER, 512, 1024, 2*MiB, 32*MiB, false, true,  false, true,	"mixed_large_rgba_no_write_use",		"Large RGBA mixed allocations, no data writes, data used"));
	randomClearGroup->addChild(new MemoryStressCase(m_context.getTestContext(), m_context.getRenderContext(), MEMOBJECTTYPE_TEXTURE|MEMOBJECTTYPE_BUFFER, 512, 1024, 2*MiB, 32*MiB, true,  true,  false, true,	"mixed_large_rgba_write_use",			"Large RGBA mixed allocations, data writes, data used"));

	addChild(basicClearGroup);
	addChild(randomClearGroup);
}